

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar32 __thiscall icu_63::UCharCharacterIterator::next32(UCharCharacterIterator *this)

{
  int iVar1;
  char16_t *pcVar2;
  int iVar3;
  uint local_20;
  uint16_t __c2;
  UChar32 c;
  int32_t i;
  UCharCharacterIterator *this_local;
  
  if ((this->super_CharacterIterator).pos < (this->super_CharacterIterator).end) {
    pcVar2 = this->text;
    iVar1 = (this->super_CharacterIterator).pos;
    (this->super_CharacterIterator).pos = iVar1 + 1;
    if ((((pcVar2[iVar1] & 0xfc00U) == 0xd800) &&
        ((this->super_CharacterIterator).pos != (this->super_CharacterIterator).end)) &&
       ((this->text[(this->super_CharacterIterator).pos] & 0xfc00U) == 0xdc00)) {
      (this->super_CharacterIterator).pos = (this->super_CharacterIterator).pos + 1;
    }
    if ((this->super_CharacterIterator).pos < (this->super_CharacterIterator).end) {
      iVar1 = (this->super_CharacterIterator).pos;
      iVar3 = iVar1 + 1;
      local_20 = (uint)(ushort)this->text[iVar1];
      if ((((local_20 & 0xfffffc00) == 0xd800) && (iVar3 != (this->super_CharacterIterator).end)) &&
         ((this->text[iVar3] & 0xfc00U) == 0xdc00)) {
        local_20 = local_20 * 0x400 + (uint)(ushort)this->text[iVar3] + 0xfca02400;
      }
      return local_20;
    }
  }
  (this->super_CharacterIterator).pos = (this->super_CharacterIterator).end;
  return 0xffff;
}

Assistant:

UChar32
UCharCharacterIterator::next32() {
    if (pos < end) {
        U16_FWD_1(text, pos, end);
        if(pos < end) {
            int32_t i = pos;
            UChar32 c;
            U16_NEXT(text, i, end, c);
            return c;
        }
    }
    /* make current() return DONE */
    pos = end;
    return DONE;
}